

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinStrReplace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  HeapEntity *pHVar2;
  long lVar3;
  HeapEntity *pHVar4;
  size_type __n;
  Interpreter *pIVar5;
  size_type __pos;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  ulong __pos_00;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar6;
  allocator<char> local_81;
  Interpreter *local_80;
  UString new_str;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_58;
  undefined8 local_3c;
  undefined4 local_34;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&new_str,"strReplace",&local_81);
  local_3c = 0x1300000013;
  local_34 = 0x13;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_3c;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_58,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&new_str,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_58);
  local_80 = this;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&new_str);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = pVVar1[1].v.h;
  lVar3._0_1_ = pHVar2[1].mark;
  lVar3._1_1_ = pHVar2[1].type;
  lVar3._2_6_ = *(undefined6 *)&pHVar2[1].field_0xa;
  if (lVar3 == 0) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&new_str,"\'from\' string must not be zero length.",
               (allocator<char> *)&local_3c);
    Stack::makeError(__return_storage_ptr__,&local_80->stack,loc,(string *)&new_str);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pHVar4 = pVVar1[2].v.h;
  std::__cxx11::u32string::u32string
            ((u32string *)&new_str,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             ((pVVar1->v).h + 1));
  __pos_00 = 0;
  while (__pos_00 < new_str._M_string_length) {
    __pos = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                      (&new_str,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                 *)(pHVar2 + 1),__pos_00);
    if (__pos == 0xffffffffffffffff) break;
    __n._0_1_ = pHVar2[1].mark;
    __n._1_1_ = pHVar2[1].type;
    __n._2_6_ = *(undefined6 *)&pHVar2[1].field_0xa;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    replace(&new_str,__pos,__n,
            (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            (pHVar4 + 1));
    __pos_00 = __pos + *(long *)&pHVar4[1].mark;
  }
  pIVar5 = local_80;
  VVar6 = makeString(local_80,&new_str);
  (pIVar5->scratch).t = STRING;
  (pIVar5->scratch).v = VVar6._0_8_;
  std::__cxx11::u32string::~u32string((u32string *)&new_str);
  return (AST *)0x0;
}

Assistant:

const AST *builtinStrReplace(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "strReplace", args, {Value::STRING, Value::STRING, Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *from = static_cast<const HeapString *>(args[1].v.h);
        const auto *to = static_cast<const HeapString *>(args[2].v.h);
        if (from->value.empty()) {
          throw makeError(loc, "'from' string must not be zero length.");
        }
        UString new_str(str->value);
        UString::size_type pos = 0;
        while (pos < new_str.size()) {
            auto index = new_str.find(from->value, pos);
            if (index == new_str.npos) {
                break;
            }
            new_str.replace(index, from->value.size(), to->value);
            pos = index + to->value.size();
        }
        scratch = makeString(new_str);
        return nullptr;
    }